

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

long true_moves(void)

{
  int iVar1;
  int32_t iVar2;
  long lVar3;
  long pos;
  long rv;
  flag sg_flags;
  you sg_you;
  
  iVar1 = diff_base.pos;
  if (loginfo.out_of_sync == '\0') {
    sg_you._1576_8_ = ZEXT48(moves);
  }
  else {
    diff_base.pos = 0;
    uptodate(&diff_base,(char *)0x0);
    restore_flags(&diff_base,(flag *)&rv);
    restore_you(&diff_base,(you *)&sg_flags.ascet);
    iVar2 = mread32(&diff_base);
    sg_you._1576_8_ = SEXT48(iVar2);
  }
  lVar3._0_4_ = sg_you.initgend;
  lVar3._4_4_ = sg_you.initalign;
  diff_base.pos = iVar1;
  return lVar3;
}

Assistant:

static long true_moves(void)
{
    struct you sg_you;
    struct flag sg_flags;
    long rv, pos;

    if (!loginfo.out_of_sync)
	return moves;

    pos = diff_base.pos;
    diff_base.pos = 0;

    /* Mimic memfile reading in dorecover() to reach where moves is stored.
     * Update this if the initial part of the save format ever changes. */
    uptodate(&diff_base, NULL);
    restore_flags(&diff_base, &sg_flags);
    restore_you(&diff_base, &sg_you);
    rv = mread32(&diff_base);	/* read out moves here */

    diff_base.pos = pos;

    return rv;
}